

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

void gauden_print(FILE *fp,float64 ***den,uint32 ***den_idx,gauden_t *g,uint32 *inv,uint32 n_inv)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (inv == (uint32 *)0x0) {
    uVar1 = g->n_mgau;
    if (uVar1 != 0) {
      uVar3 = g->n_feat;
      uVar6 = 0;
      uVar5 = uVar3;
      do {
        if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          uVar2 = (ulong)g->n_top;
          uVar4 = 0;
          do {
            if ((int)uVar2 == 0) {
              uVar2 = 0;
            }
            else {
              uVar7 = 0;
              do {
                fprintf((FILE *)fp,"(%1u %1u %1u)= [%3u] %.2e\n",den[uVar6][uVar4][uVar7],
                        uVar6 & 0xffffffff,uVar4 & 0xffffffff,uVar7 & 0xffffffff,
                        (ulong)den_idx[uVar6][uVar4][uVar7]);
                uVar7 = uVar7 + 1;
                uVar2 = (ulong)g->n_top;
              } while (uVar7 < uVar2);
              uVar3 = g->n_feat;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < uVar3);
          uVar1 = g->n_mgau;
          uVar5 = uVar3;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar1);
    }
  }
  else if (n_inv != 0) {
    uVar6 = 0;
    do {
      uVar1 = inv[uVar6];
      if (g->n_mgau <= uVar1) {
        __assert_fail("i < g->n_mgau",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x58a,
                      "void gauden_print(FILE *, float64 ***, uint32 ***, gauden_t *, uint32 *, uint32)"
                     );
      }
      uVar3 = g->n_feat;
      if (uVar3 != 0) {
        uVar2 = (ulong)g->n_top;
        uVar4 = 0;
        do {
          if ((int)uVar2 == 0) {
            uVar2 = 0;
          }
          else {
            uVar7 = 0;
            do {
              fprintf((FILE *)fp,"(%1u %1u %1u)= [%3u] %.2e\n",den[uVar1][uVar4][uVar7],(ulong)uVar1
                      ,uVar4 & 0xffffffff,uVar7 & 0xffffffff,(ulong)den_idx[uVar1][uVar4][uVar7]);
              uVar7 = uVar7 + 1;
              uVar2 = (ulong)g->n_top;
            } while (uVar7 < uVar2);
            uVar3 = g->n_feat;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar3);
      }
      uVar1 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar1;
    } while (uVar1 != n_inv);
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

void
gauden_print(FILE *fp,
	     float64 ***den,
	     uint32 ***den_idx,
	     gauden_t *g,
	     uint32 *inv,
	     uint32 n_inv)
{
    uint32 i, ii, j, k;

    if (inv == NULL) {
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_top; k++) {
		    fprintf(fp, "(%1u %1u %1u)= [%3u] %.2e\n",
			    i, j, k, den_idx[i][j][k], den[i][j][k]);
		}
	    }
	}
    }
    else {
	for (ii = 0; ii < n_inv; ii++) {

	    i = inv[ii];
	    assert(i < g->n_mgau);

	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_top; k++) {
		    fprintf(fp, "(%1u %1u %1u)= [%3u] %.2e\n",
			    i, j, k, den_idx[i][j][k], den[i][j][k]);
		}
	    }
	}
    }

    fflush(fp);
}